

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepScanLineInputFile::rawPixelData
          (DeepScanLineInputFile *this,int firstScanLine,char *pixelData,uint64_t *pixelDataSize)

{
  int iVar1;
  exr_context_t p_Var2;
  element_type *peVar3;
  ostream *poVar4;
  char *pcVar5;
  ArgExc *pAVar6;
  ulong *in_RCX;
  undefined4 *in_RDX;
  undefined4 in_ESI;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  DeepChunkHeader *dch;
  uint64_t cbytes;
  exr_chunk_info_t cinfo;
  stringstream local_390 [16];
  ostream local_380 [392];
  stringstream local_1f8 [16];
  ostream local_1e8 [376];
  undefined4 *local_70;
  ulong local_68;
  undefined1 local_60 [8];
  undefined4 local_58;
  long local_40;
  undefined8 local_38;
  long local_28;
  ulong *local_20;
  undefined4 *local_18;
  undefined4 local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x1a5e88);
  peVar3 = std::
           __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a5e9b);
  iVar1 = exr_read_scanline_chunk_info(p_Var2,peVar3->partNumber,local_c,local_60);
  if (iVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_390);
    poVar4 = std::operator<<(local_380,"Error reading deep pixel data from image file \"");
    pcVar5 = fileName((DeepScanLineInputFile *)0x1a616d);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\". Unable to query data block information.");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,local_390);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_68 = local_40 + local_28 + 0x1c;
  if ((local_18 == (undefined4 *)0x0) || (*local_20 < local_68)) {
    *local_20 = local_68;
  }
  else {
    *local_20 = local_68;
    local_70 = local_18;
    *local_18 = local_58;
    *(long *)(local_18 + 1) = local_28;
    *(long *)(local_18 + 3) = local_40;
    *(undefined8 *)(local_18 + 5) = local_38;
    local_18 = local_18 + 7;
    p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x1a5fc5);
    peVar3 = std::
             __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a5fd8);
    iVar1 = exr_read_deep_chunk(p_Var2,peVar3->partNumber,local_60,(long)local_18 + local_28,
                                local_18);
    if (iVar1 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1f8);
      poVar4 = std::operator<<(local_1e8,"Error reading deep pixel data from image file \"");
      pcVar5 = fileName((DeepScanLineInputFile *)0x1a604a);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,"\". Unable to read raw pixel data of ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_20);
      std::operator<<(poVar4," bytes.");
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar6,local_1f8);
      __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  return;
}

Assistant:

void
DeepScanLineInputFile::rawPixelData (
    int firstScanLine, char* pixelData, uint64_t& pixelDataSize)
{
    exr_chunk_info_t cinfo;

    static_assert (sizeof(DeepChunkHeader) == 28, "Expect a 28-byte chunk header");

    // api is kind of different than the normal scanline raw pixel data
    // in that it also includes the chunk header block, so the full chunk

    if (EXR_ERR_SUCCESS == exr_read_scanline_chunk_info (
            _ctxt, _data->partNumber, firstScanLine, &cinfo))
    {
        uint64_t cbytes;
        cbytes = sizeof (DeepChunkHeader);
        cbytes += cinfo.sample_count_table_size;
        cbytes += cinfo.packed_size;

        if (!pixelData || cbytes > pixelDataSize)
        {
            pixelDataSize = cbytes;
            return;
        }

        pixelDataSize = cbytes;

        DeepChunkHeader* dch = reinterpret_cast<DeepChunkHeader*> (pixelData);
        dch->scanline = cinfo.start_y;
        dch->packedCountSize = cinfo.sample_count_table_size;
        dch->packedDataSize = cinfo.packed_size;
        dch->unpackedDataSize = cinfo.unpacked_size;

        pixelData += sizeof(DeepChunkHeader);
        if (EXR_ERR_SUCCESS !=
            exr_read_deep_chunk (
                _ctxt,
                _data->partNumber,
                &cinfo,
                pixelData + cinfo.sample_count_table_size,
                pixelData))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading deep pixel data from image "
                "file \""
                << fileName () << "\". Unable to read raw pixel data of "
                << pixelDataSize << " bytes.");
        }
    }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error reading deep pixel data from image "
            "file \""
            << fileName ()
            << "\". Unable to query data block information.");
    }
}